

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution.hpp
# Opt level: O0

void mxx::
     distribute<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
               (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> end,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> out,comm *comm)

{
  pointer *this;
  bool bVar1;
  int iVar2;
  int iVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  iterator __first;
  iterator __last;
  long lVar6;
  reference msgs;
  reference out_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_158;
  unsigned_long *local_150;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_148;
  int *local_140;
  comm *local_138;
  int *local_130;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_128;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_120;
  unsigned_long *local_118;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_110;
  undefined1 local_108 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_counts;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_counts;
  undefined1 local_b8 [8];
  vector<long,_std::allocator<long>_> surpluses;
  signed_size_t surplus;
  block_decomposition<unsigned_long> part;
  size_t total_size;
  unsigned_long local_50;
  size_t local_size;
  comm *local_40;
  int *local_38;
  int *local_30;
  comm *local_28;
  comm *comm_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> out_local;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> end_local;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> begin_local;
  
  local_28 = comm;
  comm_local = (comm *)out._M_current;
  out_local._M_current = end._M_current;
  end_local = begin;
  iVar2 = mxx::comm::size(comm);
  if (iVar2 == 1) {
    local_30 = end_local._M_current;
    local_38 = out_local._M_current;
    local_40 = comm_local;
    std::
    copy<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              (end_local,
               (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
               out_local._M_current,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)comm_local);
  }
  else {
    local_50 = std::
               distance<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                         (end_local,
                          (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                          out_local._M_current);
    uVar4 = allreduce<unsigned_long>(&local_50,local_28);
    bVar1 = any_of(local_50 == uVar4,local_28);
    if (bVar1) {
      part._16_8_ = comm_local;
      impl::
      distribute_scatter<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                (end_local,
                 (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                 out_local._M_current,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)comm_local,uVar4
                 ,local_28);
    }
    else {
      iVar2 = mxx::comm::size(local_28);
      iVar3 = mxx::comm::rank(local_28);
      partition::block_decomposition<unsigned_long>::block_decomposition
                ((block_decomposition<unsigned_long> *)&surplus,uVar4,iVar2,iVar3);
      uVar4 = local_50;
      uVar5 = partition::block_decomposition<unsigned_long>::local_size
                        ((block_decomposition<unsigned_long> *)&surplus);
      surpluses.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)(uVar4 - uVar5);
      allgather<long>((vector<long,_std::allocator<long>_> *)local_b8,
                      (long *)&surpluses.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,local_28);
      __first = std::vector<long,_std::allocator<long>_>::begin
                          ((vector<long,_std::allocator<long>_> *)local_b8);
      __last = std::vector<long,_std::allocator<long>_>::end
                         ((vector<long,_std::allocator<long>_> *)local_b8);
      lVar6 = std::
              accumulate<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
                        ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
                         __first._M_current,
                         (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
                         __last._M_current,0);
      if (lVar6 != 0) {
        assert_fail("std::accumulate(surpluses.begin(), surpluses.end(), (impl::signed_size_t)0) == 0"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/distribution.hpp"
                    ,0xe1,"distribute");
      }
      iVar2 = mxx::comm::size(local_28);
      iVar3 = mxx::comm::rank(local_28);
      impl::surplus_send_pairing
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<long,_std::allocator<long>_> *)local_b8,iVar2,iVar3,false);
      all2all<unsigned_long>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_108,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,local_28);
      if ((long)surpluses.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage < 1) {
        this = &recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_148._M_current =
             (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this);
        local_150 = (unsigned_long *)
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this);
        uVar4 = std::
                accumulate<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                          (local_148,
                           (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            )local_150,0);
        if (uVar4 != 0) {
          assert_fail("std::accumulate(send_counts.begin(), send_counts.end(), (size_t)0) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/distribution.hpp"
                      ,0xed,"distribute");
        }
        local_158 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator+((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              &comm_local,local_50);
        out_00 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&local_158);
        all2allv<int>((int *)0x0,
                      (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      &recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,out_00,
                      (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_108,local_28);
        std::
        copy<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  (end_local,
                   (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                   out_local._M_current,
                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)comm_local);
      }
      else {
        local_110._M_current =
             (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_108);
        local_118 = (unsigned_long *)
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_108);
        uVar4 = std::
                accumulate<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                          (local_110,
                           (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            )local_118,0);
        if (uVar4 != 0) {
          assert_fail("std::accumulate(recv_counts.begin(), recv_counts.end(), (size_t)0) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/distribution.hpp"
                      ,0xe8,"distribute");
        }
        local_120 = __gnu_cxx::
                    __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator+(&end_local,
                              local_50 -
                              (long)surpluses.super__Vector_base<long,_std::allocator<long>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        msgs = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_120);
        all2allv<int>(msgs,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           &recv_counts.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,(int *)0x0,
                      (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_108,local_28);
        local_128._M_current = end_local._M_current;
        local_130 = (int *)__gnu_cxx::
                           __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                           operator+(&end_local,
                                     local_50 -
                                     (long)surpluses.super__Vector_base<long,_std::allocator<long>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        local_138 = comm_local;
        local_140 = (int *)std::
                           copy<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                                     (local_128,
                                      (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                       )local_130,
                                      (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                       )comm_local);
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_108);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<long,_std::allocator<long>_>::~vector
                ((vector<long,_std::allocator<long>_> *)local_b8);
      partition::block_decomposition<unsigned_long>::~block_decomposition
                ((block_decomposition<unsigned_long> *)&surplus);
    }
  }
  return;
}

Assistant:

void distribute(_InIterator begin, _InIterator end, _OutIterator out, const mxx::comm& comm) {
    // if single process, copy input to output
    if (comm.size() == 1) {
        std::copy(begin, end, out);
        return;
    }

    // get sizes
    size_t local_size = std::distance(begin, end);
    size_t total_size = mxx::allreduce(local_size, comm);
    typedef typename std::iterator_traits<_InIterator>::value_type T;

    if (mxx::any_of(local_size == total_size, comm)) {
        // use scatterv instead of all2all based communication
        impl::distribute_scatter(begin, end, out, total_size, comm);
    } else {
        // use surplus send-pairing to minimize total communication volume
        // TODO: use all2all or send/recv depending on the maximum number of
        //       paired processes

        // get surplus
        partition::block_decomposition<std::size_t> part(total_size, comm.size(), comm.rank());
        impl::signed_size_t surplus = (impl::signed_size_t)local_size - (impl::signed_size_t)part.local_size();

        // allgather surpluses
        // TODO figure out how to do surplus send pairing without requiring allgather
        std::vector<impl::signed_size_t> surpluses = mxx::allgather(surplus, comm);
        MXX_ASSERT(std::accumulate(surpluses.begin(), surpluses.end(), (impl::signed_size_t)0) == 0);

        // get send counts
        std::vector<size_t> send_counts = impl::surplus_send_pairing(surpluses, comm.size(), comm.rank(), false);
        std::vector<size_t> recv_counts = mxx::all2all(send_counts, comm);

        if (surplus > 0) {
            MXX_ASSERT(std::accumulate(recv_counts.begin(), recv_counts.end(), (size_t)0) == 0);
            // TODO: use iterators not pointers
            mxx::all2allv(&(*(begin+((impl::signed_size_t)local_size-surplus))), send_counts, (T*)nullptr, recv_counts, comm);
            std::copy(begin, begin+(local_size-surplus), out);
        } else {
            MXX_ASSERT(std::accumulate(send_counts.begin(), send_counts.end(), (size_t)0) == 0);
            mxx::all2allv((const T*)nullptr, send_counts, &(*(out+local_size)), recv_counts, comm);
            std::copy(begin, end, out);
        }
    }
}